

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *
cfd::TransactionContext::CheckMultisig
          (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *__return_storage_ptr__,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_list,
          Script *redeem_script)

{
  SignParameter *this;
  pointer pSVar1;
  pointer *ppuVar2;
  char cVar3;
  int iVar4;
  iterator __position;
  CfdException *pCVar5;
  pointer pSVar6;
  bool bVar7;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *signature_list;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  string pubkey_hex;
  Pubkey related_pubkey;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  SignParameter sign_param;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  CfdSourceLocation local_128;
  Script *local_110;
  pointer local_108;
  pointer local_100;
  undefined1 local_f8 [24];
  SignParameter local_e0;
  Pubkey local_68;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pSVar6 = (sign_list->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (sign_list->super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((pSVar6 == pSVar1) ||
     (0xf < (ulong)(((long)pSVar1 - (long)pSVar6 >> 3) * -0x1111111111111111))) {
    local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfd_transaction.cpp";
    local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x2dc;
    local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CheckMultisig";
    core::logger::log<unsigned_int_const&>
              ((CfdSourceLocation *)(local_f8 + 0x18),kCfdLogLevelWarning,
               "Failed to CheckMultisig. sign array is \'1 - {}\'.",&kMaximumMultisigKeyNum);
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((long)&local_e0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_f8 + 0x18),"Value out of range. sign array length fail.","");
    core::CfdException::CfdException(pCVar5,kCfdOutOfRangeError,(string *)(local_f8 + 0x18));
    __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  local_110 = redeem_script;
  cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript((Script *)local_f8,(uint *)redeem_script);
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector(&local_160,sign_list)
  ;
  local_108 = (pointer)local_f8._8_8_;
  if (local_f8._0_8_ != local_f8._8_8_) {
    this = (SignParameter *)(local_f8 + 0x18);
    do {
      local_100 = (pointer)local_f8._0_8_;
      cfd::core::Pubkey::GetHex_abi_cxx11_();
      __position._M_current =
           local_160.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
           _M_impl.super__Vector_impl_data._M_start;
      while (__position._M_current !=
             local_160.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
             _M_impl.super__Vector_impl_data._M_finish) {
        SignParameter::SignParameter(this,__position._M_current);
        SignParameter::GetRelatedPubkey((Pubkey *)&local_128,this);
        cVar3 = cfd::core::Pubkey::IsValid();
        bVar7 = true;
        if (cVar3 != '\0') {
          cfd::core::Pubkey::GetHex_abi_cxx11_();
          if (local_48 == local_148._M_string_length) {
            if (local_48 == 0) {
              bVar7 = false;
            }
            else {
              iVar4 = bcmp(local_50,local_148._M_dataplus._M_p,local_48);
              bVar7 = iVar4 != 0;
            }
          }
        }
        if ((cVar3 != '\0') && (local_50 != local_40)) {
          operator_delete(local_50);
        }
        if (bVar7) {
          __position._M_current = __position._M_current + 1;
        }
        else {
          __position = std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::
                       _M_erase(&local_160,__position);
          std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                    (__return_storage_ptr__,this);
        }
        if (local_128.filename != (char *)0x0) {
          operator_delete(local_128.filename);
        }
        local_e0.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_002b2f30;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0.op_code_.text_data_._M_dataplus._M_p !=
            &local_e0.op_code_.text_data_.field_2) {
          operator_delete(local_e0.op_code_.text_data_._M_dataplus._M_p);
        }
        if (local_e0.related_pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.related_pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p);
      }
      local_f8._0_8_ = local_100 + 1;
    } while ((pointer)local_f8._0_8_ != local_108);
  }
  if (local_160.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_160.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar6 = local_160.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      SignParameter::GetRelatedPubkey((Pubkey *)(local_f8 + 0x18),pSVar6);
      cVar3 = cfd::core::Pubkey::IsValid();
      if (local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (cVar3 != '\0') {
        local_128.filename = "cfd_transaction.cpp";
        local_128.line = 0x2fe;
        local_128.funcname = "CheckMultisig";
        SignParameter::GetRelatedPubkey(&local_68,pSVar6);
        cfd::core::Pubkey::GetHex_abi_cxx11_();
        cfd::core::Script::GetHex_abi_cxx11_();
        core::logger::log<std::__cxx11::string&,std::__cxx11::string_const&>
                  (&local_128,kCfdLogLevelWarning,
                   "Failed to CheckMultisig. Missing related pubkey in script.: relatedPubkey={}, script={}"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_f8 + 0x18),&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p);
        }
        ppuVar2 = (pointer *)
                  ((long)&local_e0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 0x10);
        if ((pointer *)
            local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != ppuVar2) {
          operator_delete(local_e0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(local_f8 + 0x18),
                   "Missing related pubkey in script. Check your signature and pubkey pair.","");
        core::CfdException::CfdException
                  (pCVar5,kCfdIllegalArgumentError,(string *)(local_f8 + 0x18));
        __cxa_throw(pCVar5,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::push_back
                (__return_storage_ptr__,pSVar6);
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != local_160.
                       super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_160);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_f8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<SignParameter> TransactionContext::CheckMultisig(
    const std::vector<SignParameter>& sign_list, const Script& redeem_script) {
  // check signData (too much data)
  if (sign_list.empty() || (sign_list.size() > kMaximumMultisigKeyNum)) {
    warn(
        CFD_LOG_SOURCE, "Failed to CheckMultisig. sign array is '1 - {}'.",
        kMaximumMultisigKeyNum);
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Value out of range. sign array length fail.");
  }

  // check multisig format and extract pubkey.
  std::vector<Pubkey> pubkeys =
      ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script);

  std::vector<SignParameter> signature_list;
  std::vector<SignParameter> sign_params = sign_list;
  for (const Pubkey& pubkey : pubkeys) {
    std::string pubkey_hex = pubkey.GetHex();
    for (auto itr = sign_params.begin(); itr != sign_params.end();) {
      SignParameter sign_param = *itr;
      Pubkey related_pubkey = sign_param.GetRelatedPubkey();
      if ((!related_pubkey.IsValid()) ||
          (related_pubkey.GetHex() != pubkey_hex)) {
        ++itr;
        continue;
      }

      itr = sign_params.erase(itr);
      signature_list.push_back(sign_param);
    }
  }

  // set the others to signature data
  for (const auto& sign_param : sign_params) {
    // related pubkey not found in script
    if (sign_param.GetRelatedPubkey().IsValid()) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CheckMultisig. Missing related pubkey"
          " in script.: relatedPubkey={}, script={}",
          sign_param.GetRelatedPubkey().GetHex(), redeem_script.GetHex());
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Missing related pubkey in script."
          " Check your signature and pubkey pair.");
    }
    signature_list.push_back(sign_param);
  }

  return signature_list;
}